

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilMisc.c
# Opt level: O2

uint ** Extra_TruthPerm63(void)

{
  uint **ppuVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  uint uTruth [2];
  
  ppuVar1 = (uint **)Extra_ArrayAlloc(0x100,0x40,8);
  for (lVar2 = 0; lVar2 != 0x100; lVar2 = lVar2 + 1) {
    uTruth[0] = (int)lVar2 * 0x1010101;
    lVar3 = 0;
    uTruth[1] = uTruth[0];
    for (lVar4 = 0; lVar4 != 0x40; lVar4 = lVar4 + 1) {
      Extra_TruthPerm6One(uTruth,(int)lVar4,(uint *)((long)ppuVar1[lVar2] + lVar3));
      lVar3 = lVar3 + 4;
    }
  }
  return ppuVar1;
}

Assistant:

unsigned ** Extra_TruthPerm63()
{
    unsigned ** pTable;
    unsigned uTruth[2];
    int i, k;
    pTable = (unsigned **)Extra_ArrayAlloc( 256, 64, 8 );
    for ( i = 0; i < 256; i++ )
    {
        uTruth[0] = (i << 24) | (i << 16) | (i << 8) | i;
        uTruth[1] = uTruth[0];
        for ( k = 0; k < 64; k++ )
            Extra_TruthPerm6One( uTruth, k, &pTable[i][k] );
    }
    return pTable;
}